

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O3

bool callOnceGetSum(void)

{
  int iVar1;
  code *pcVar2;
  iterator iVar3;
  bool bVar4;
  long *plVar5;
  Test t;
  key_type local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_40;
  
  Test::Test((Test *)&local_40);
  plVar5 = (long *)(&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)&local_40._M_impl)->_M_t)._M_impl.field_0x0 + DAT_001070e8);
  pcVar2 = accessor::
           Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
           ::value;
  if (((ulong)accessor::
              Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
              ::value & 1) != 0) {
    pcVar2 = *(code **)(accessor::
                        Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
                        ::value + *plVar5 + -1);
  }
  iVar1 = (*pcVar2)(plVar5,1,1);
  if (iVar1 == 2) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"getSum","");
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&local_40,&local_60);
    if ((_Rb_tree_header *)iVar3._M_node == &local_40._M_impl.super__Rb_tree_header) {
      bVar4 = false;
    }
    else {
      bVar4 = 0 < (int)iVar3._M_node[2]._M_color;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = false;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_40);
  return bVar4;
}

Assistant:

bool callOnceGetSum()
{
  Test t;

  return (::accessor::callFunction<TestGetSum>(t, 1, 1) == 2) &&
         (t.getMethodVisitedCounter("getSum") > 0);
}